

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

void duckdb::EntropyFunction<duckdb::ModeStandard<float>>::
     Finalize<double,duckdb::ModeState<float,duckdb::ModeStandard<float>>>
               (ModeState<float,_duckdb::ModeStandard<float>_> *state,double *target,
               AggregateFinalizeData *finalize_data)

{
  double *in_RSI;
  double dVar1;
  ModeState<float,_duckdb::ModeStandard<float>_> *in_stack_00000028;
  
  dVar1 = FinalizeEntropy<duckdb::ModeState<float,duckdb::ModeStandard<float>>>(in_stack_00000028);
  *in_RSI = dVar1;
  return;
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		target = FinalizeEntropy(state);
	}